

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O3

void Wln_WriteVerInt(FILE *pFile,Wln_Ntk_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  int *piVar12;
  char *pcVar13;
  Wln_Vec_t *pWVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  size_t sVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  char Range [100];
  
  fprintf((FILE *)pFile,"module %s ( ",p->pName);
  fwrite("\n   ",4,1,(FILE *)pFile);
  if (0 < (p->vCis).nSize) {
    Wln_WriteVerIntVec(pFile,p,&p->vCis,3);
    fwrite(",\n   ",5,1,(FILE *)pFile);
  }
  if (0 < (p->vCos).nSize) {
    Wln_WriteVerIntVec(pFile,p,&p->vCos,3);
  }
  uVar20 = 1;
  fwrite("  );\n",5,1,(FILE *)pFile);
  if (1 < (p->vTypes).nSize) {
    lVar26 = 0x18;
    lVar25 = 0x1c;
    do {
      if ((long)(p->vRanges).nSize <= (long)uVar20) goto LAB_0038d44a;
      iVar4 = (p->vRanges).pArray[uVar20];
      if (iVar4 < 0) goto LAB_0038d42b;
      pVVar1 = p->pRanges->vObjs;
      uVar3 = iVar4 * 4;
      if (pVVar1->nSize <= (int)uVar3) goto LAB_0038d42b;
      piVar12 = pVVar1->pArray;
      uVar15 = piVar12[uVar3];
      iVar21 = 0;
      iVar4 = 0;
      if (uVar15 != 0) {
        uVar24 = (ulong)-uVar15;
        if (0 < (int)uVar15) {
          uVar24 = (ulong)uVar15;
        }
        iVar4 = -1;
        do {
          uVar19 = (uint)uVar24;
          uVar24 = uVar24 / 10;
          iVar4 = iVar4 + 1;
        } while (9 < uVar19);
      }
      uVar3 = piVar12[(ulong)uVar3 + 1];
      if (uVar3 != 0) {
        uVar24 = (ulong)-uVar3;
        if (0 < (int)uVar3) {
          uVar24 = (ulong)uVar3;
        }
        iVar21 = -1;
        do {
          uVar19 = (uint)uVar24;
          uVar24 = uVar24 / 10;
          iVar21 = iVar21 + 1;
        } while (9 < uVar19);
      }
      pcVar18 = "       ";
      if (p->fSmtLib == 0) {
        if ((long)(p->vSigns).nSize <= (long)uVar20) goto LAB_0038d469;
        pcVar18 = "signed ";
        if ((p->vSigns).pArray[uVar20] == '\0') {
          pcVar18 = "       ";
        }
      }
      sprintf(Range,"%s[%d:%d]%*s",pcVar18,(ulong)uVar15,(ulong)uVar3,
              (ulong)(6 - (iVar4 + iVar21 + (-((int)uVar3 >> 0x1f) - ((int)uVar15 >> 0x1f)))),"");
      fwrite("  ",2,1,(FILE *)pFile);
      if ((long)(p->vTypes).nSize <= (long)uVar20) {
LAB_0038d44a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = (p->vTypes).pArray[uVar20];
      pcVar18 = "       ";
      if (iVar4 == 4) {
        pcVar18 = "output ";
      }
      if (iVar4 == 3) {
        pcVar18 = "input  ";
      }
      fwrite(pcVar18,7,1,(FILE *)pFile);
      if ((long)(p->vTypes).nSize <= (long)uVar20) goto LAB_0038d44a;
      iVar4 = (p->vTypes).pArray[uVar20];
      iVar21 = (int)uVar20;
      if (0xfffffffd < iVar4 - 5U) {
        pcVar18 = Wln_ObjName(p,iVar21);
        fprintf((FILE *)pFile,"wire %s %s ;\n",Range,pcVar18);
        if ((long)(p->vTypes).nSize <= (long)uVar20) goto LAB_0038d44a;
        if ((p->vTypes).pArray[uVar20] != 3) {
          fwrite("  assign                         ",0x21,1,(FILE *)pFile);
          pcVar18 = Wln_ObjName(p,iVar21);
          paVar5 = &p->vFanins[uVar20].field_2;
          if (2 < p->vFanins[uVar20].nSize) {
            paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
          }
          pcVar13 = Wln_ObjName(p,paVar5->Array[0]);
          fprintf((FILE *)pFile,"%-16s = %s ;\n",pcVar18,pcVar13);
        }
        goto LAB_0038c67e;
      }
      pcVar18 = "wire %s ";
      if (iVar4 - 0x2bU < 2) {
        pcVar18 = "reg  %s ";
      }
      fprintf((FILE *)pFile,pcVar18,Range);
      if ((long)(p->vTypes).nSize <= (long)uVar20) goto LAB_0038d44a;
      iVar4 = (p->vTypes).pArray[uVar20];
      if (iVar4 < 0x4b) {
        if (0x47 < iVar4) {
          if (1 < iVar4 - 0x48U) goto LAB_0038c309;
          paVar5 = &p->vFanins[uVar20].field_2;
          if (2 < p->vFanins[uVar20].nSize) {
            paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
          }
          if ((long)(p->vRanges).nSize <= (long)uVar20) goto LAB_0038d44a;
          iVar4 = (p->vRanges).pArray[uVar20];
          if (iVar4 < 0) {
LAB_0038d42b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          pVVar1 = p->pRanges->vObjs;
          uVar3 = iVar4 * 4;
          if (pVVar1->nSize <= (int)uVar3) goto LAB_0038d42b;
          uVar15 = paVar5->Array[1];
          piVar12 = pVVar1->pArray;
          uVar19 = piVar12[uVar3] - piVar12[(ulong)uVar3 + 1];
          uVar3 = -uVar19;
          if (0 < (int)uVar19) {
            uVar3 = uVar19;
          }
          if (((int)uVar15 < 1) || (uVar3 < uVar15)) {
            __assert_fail("Num0 > 0 && Num0 < Wln_ObjRange(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnWriteVer.c"
                          ,0xcb,"void Wln_WriteVerInt(FILE *, Wln_Ntk_t *)");
          }
          pcVar18 = Wln_ObjName(p,iVar21);
          fprintf((FILE *)pFile,"%-16s = ",pcVar18);
          if ((long)(p->vTypes).nSize <= (long)uVar20) goto LAB_0038d44a;
          paVar5 = &p->vFanins[uVar20].field_2;
          if ((p->vTypes).pArray[uVar20] == 0x49) {
            if (2 < *(int *)((long)paVar5 + -4)) {
              paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
            }
            pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
            paVar5 = &p->vFanins[uVar20].field_2;
            if (2 < p->vFanins[uVar20].nSize) {
              paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
            }
            pcVar13 = Wln_ObjName(p,paVar5->Array[0]);
            pcVar6 = "(%s >> %d) | (%s << %d)";
          }
          else {
            if (2 < *(int *)((long)paVar5 + -4)) {
              paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
            }
            pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
            paVar5 = &p->vFanins[uVar20].field_2;
            if (2 < p->vFanins[uVar20].nSize) {
              paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
            }
            pcVar13 = Wln_ObjName(p,paVar5->Array[0]);
            pcVar6 = "(%s << %d) | (%s >> %d)";
          }
          fprintf((FILE *)pFile,pcVar6,pcVar18,(ulong)uVar15,pcVar13,(ulong)((uVar3 - uVar15) + 1));
          goto LAB_0038c4df;
        }
        if (iVar4 == 0x2b) {
          pcVar18 = Wln_ObjName(p,iVar21);
          fprintf((FILE *)pFile,"%s ;\n",pcVar18);
          fwrite("         ",9,1,(FILE *)pFile);
          fwrite("always @( ",10,1,(FILE *)pFile);
          pWVar14 = p->vFanins;
          uVar24 = (ulong)(uint)pWVar14[uVar20].nSize;
          if (0 < pWVar14[uVar20].nSize) {
            lVar29 = 0;
            do {
              if ((int)uVar24 < 3) {
                piVar12 = (int *)((long)&pWVar14->nCap + lVar26);
              }
              else {
                piVar12 = pWVar14[uVar20].field_2.pArray[0];
              }
              if (piVar12[lVar29] != 0) {
                pcVar18 = " or ";
                if (lVar29 == 0) {
                  pcVar18 = "";
                }
                pcVar13 = Wln_ObjName(p,piVar12[lVar29]);
                fprintf((FILE *)pFile,"%s%s",pcVar18,pcVar13);
                pWVar14 = p->vFanins;
              }
              lVar29 = lVar29 + 1;
              uVar24 = (ulong)pWVar14[uVar20].nSize;
            } while (lVar29 < (long)uVar24);
          }
          fwrite(" )\n",3,1,(FILE *)pFile);
          fwrite("           ",0xb,1,(FILE *)pFile);
          fwrite("begin\n",6,1,(FILE *)pFile);
          fwrite("             ",0xd,1,(FILE *)pFile);
          paVar5 = &p->vFanins[uVar20].field_2;
          if (2 < p->vFanins[uVar20].nSize) {
            paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
          }
          pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
          fprintf((FILE *)pFile,"case ( %s )\n",pcVar18);
          pWVar14 = p->vFanins;
          uVar24 = (ulong)(uint)pWVar14[uVar20].nSize;
          if (0 < pWVar14[uVar20].nSize) {
            lVar27 = 0;
            lVar29 = lVar26;
            do {
              if ((int)uVar24 < 3) {
                piVar12 = (int *)((long)&pWVar14->nCap + lVar29);
              }
              else {
                piVar12 = pWVar14[uVar20].field_2.pArray[0] + lVar27;
              }
              if ((lVar27 != 0) && (*piVar12 != 0)) {
                fwrite("               ",0xf,1,(FILE *)pFile);
                pcVar18 = Wln_ObjName(p,iVar21);
                fprintf((FILE *)pFile,"%d : %s = ",(ulong)((int)lVar27 - 1),pcVar18);
                pWVar14 = p->vFanins;
                if (pWVar14[uVar20].nSize < 3) {
                  piVar12 = (int *)((long)&pWVar14->nCap + lVar29);
                }
                else {
                  piVar12 = pWVar14[uVar20].field_2.pArray[0] + lVar27;
                }
                pcVar18 = Wln_ObjName(p,*piVar12);
                fprintf((FILE *)pFile,"%s ;\n",pcVar18);
                pWVar14 = p->vFanins;
              }
              lVar27 = lVar27 + 1;
              uVar24 = (ulong)pWVar14[uVar20].nSize;
              lVar29 = lVar29 + 4;
            } while (lVar27 < (long)uVar24);
          }
          fwrite("             ",0xd,1,(FILE *)pFile);
          fwrite("endcase\n",8,1,(FILE *)pFile);
          fwrite("           ",0xb,1,(FILE *)pFile);
          fwrite("end\n",4,1,(FILE *)pFile);
        }
        else {
          if (iVar4 == 0x2c) {
            pcVar18 = Wln_ObjName(p,iVar21);
            fprintf((FILE *)pFile,"%s ;\n",pcVar18);
            fwrite("         ",9,1,(FILE *)pFile);
            fwrite("always @( ",10,1,(FILE *)pFile);
            pWVar14 = p->vFanins;
            uVar24 = (ulong)(uint)pWVar14[uVar20].nSize;
            if (0 < pWVar14[uVar20].nSize) {
              lVar29 = 0;
              do {
                if ((int)uVar24 < 3) {
                  piVar12 = (int *)((long)&pWVar14->nCap + lVar26);
                }
                else {
                  piVar12 = pWVar14[uVar20].field_2.pArray[0];
                }
                if (piVar12[lVar29] != 0) {
                  pcVar18 = " or ";
                  if (lVar29 == 0) {
                    pcVar18 = "";
                  }
                  pcVar13 = Wln_ObjName(p,piVar12[lVar29]);
                  fprintf((FILE *)pFile,"%s%s",pcVar18,pcVar13);
                  pWVar14 = p->vFanins;
                }
                lVar29 = lVar29 + 1;
                uVar24 = (ulong)pWVar14[uVar20].nSize;
              } while (lVar29 < (long)uVar24);
            }
            fwrite(" )\n",3,1,(FILE *)pFile);
            fwrite("           ",0xb,1,(FILE *)pFile);
            fwrite("begin\n",6,1,(FILE *)pFile);
            fwrite("             ",0xd,1,(FILE *)pFile);
            paVar5 = &p->vFanins[uVar20].field_2;
            if (2 < p->vFanins[uVar20].nSize) {
              paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
            }
            pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
            fprintf((FILE *)pFile,"case ( %s )\n",pcVar18);
            pWVar14 = p->vFanins;
            uVar24 = (ulong)(uint)pWVar14[uVar20].nSize;
            if (0 < pWVar14[uVar20].nSize) {
              uVar28 = 0;
              do {
                paVar5 = &pWVar14[uVar20].field_2;
                if (2 < (int)uVar24) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                if ((uVar28 != 0) && (paVar5->Array[uVar28] != 0)) {
                  fwrite("               ",0xf,1,(FILE *)pFile);
                  fprintf((FILE *)pFile,"%d\'b",(ulong)(p->vFanins[uVar20].nSize - 1));
                  iVar4 = p->vFanins[uVar20].nSize;
                  if (1 < iVar4) {
                    uVar3 = iVar4 + 1;
                    uVar24 = (ulong)(iVar4 - 1);
                    do {
                      fprintf((FILE *)pFile,"%d",(ulong)(uVar28 == uVar24));
                      uVar3 = uVar3 - 1;
                      uVar24 = uVar24 - 1;
                    } while (2 < uVar3);
                  }
                  pcVar18 = Wln_ObjName(p,iVar21);
                  fprintf((FILE *)pFile," : %s = ",pcVar18);
                  paVar5 = &p->vFanins[uVar20].field_2;
                  if (2 < p->vFanins[uVar20].nSize) {
                    paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                  }
                  pcVar18 = Wln_ObjName(p,paVar5->Array[uVar28]);
                  fprintf((FILE *)pFile,"%s ;\n",pcVar18);
                  pWVar14 = p->vFanins;
                }
                uVar28 = uVar28 + 1;
                uVar24 = (ulong)pWVar14[uVar20].nSize;
              } while ((long)uVar28 < (long)uVar24);
            }
            fwrite("               ",0xf,1,(FILE *)pFile);
            fwrite("default",7,1,(FILE *)pFile);
            pcVar18 = Wln_ObjName(p,iVar21);
            fprintf((FILE *)pFile," : %s = ",pcVar18);
            if ((long)(p->vRanges).nSize <= (long)uVar20) goto LAB_0038d44a;
            iVar4 = (p->vRanges).pArray[uVar20];
            if (iVar4 < 0) goto LAB_0038d42b;
            pVVar1 = p->pRanges->vObjs;
            uVar3 = iVar4 * 4;
            if (pVVar1->nSize <= (int)uVar3) goto LAB_0038d42b;
            piVar12 = pVVar1->pArray;
            iVar21 = piVar12[uVar3] - piVar12[(ulong)uVar3 + 1];
            iVar4 = -iVar21;
            if (0 < iVar21) {
              iVar4 = iVar21;
            }
            fprintf((FILE *)pFile,"%d\'b",(ulong)(iVar4 + 1));
            if ((long)(p->vRanges).nSize <= (long)uVar20) goto LAB_0038d44a;
            iVar4 = (p->vRanges).pArray[uVar20];
            if (iVar4 < 0) goto LAB_0038d42b;
            pVVar1 = p->pRanges->vObjs;
            uVar3 = iVar4 * 4;
            if (pVVar1->nSize <= (int)uVar3) goto LAB_0038d42b;
            piVar12 = pVVar1->pArray;
            iVar4 = piVar12[uVar3];
            iVar21 = piVar12[(ulong)uVar3 + 1];
            iVar16 = iVar4 - iVar21;
            iVar21 = iVar21 - iVar4;
            if (iVar21 <= iVar16) {
              iVar21 = iVar16;
            }
            uVar3 = iVar21 + 2;
            do {
              fprintf((FILE *)pFile,"%d",0);
              uVar3 = uVar3 - 1;
            } while (1 < uVar3);
            fwrite(" ;\n",3,1,(FILE *)pFile);
            fwrite("             ",0xd,1,(FILE *)pFile);
            fwrite("endcase\n",8,1,(FILE *)pFile);
            fwrite("           ",0xb,1,(FILE *)pFile);
            sVar23 = 4;
            pcVar18 = "end\n";
          }
          else {
            if (iVar4 != 0x30) goto LAB_0038c309;
            paVar5 = &p->vFanins[uVar20].field_2;
            if (2 < p->vFanins[uVar20].nSize) {
              paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
            }
            iVar4 = paVar5->Array[0];
            if (((long)iVar4 < 0) || (uVar3 = (p->vRanges).nSize, (int)uVar3 <= iVar4))
            goto LAB_0038d44a;
            piVar12 = (p->vRanges).pArray;
            iVar4 = piVar12[iVar4];
            if (iVar4 < 0) goto LAB_0038d42b;
            pVVar1 = p->pRanges->vObjs;
            uVar15 = iVar4 * 4;
            iVar4 = pVVar1->nSize;
            if (iVar4 <= (int)uVar15) goto LAB_0038d42b;
            piVar2 = pVVar1->pArray;
            uVar19 = piVar2[uVar15] - piVar2[(ulong)uVar15 + 1];
            uVar15 = -uVar19;
            if (0 < (int)uVar19) {
              uVar15 = uVar19;
            }
            if (uVar3 <= uVar20) goto LAB_0038d44a;
            iVar16 = piVar12[uVar20];
            if ((iVar16 < 0) || (uVar3 = iVar16 * 4, iVar4 <= (int)uVar3)) goto LAB_0038d42b;
            iVar16 = piVar2[uVar3] - piVar2[(ulong)uVar3 + 1];
            iVar4 = -iVar16;
            if (0 < iVar16) {
              iVar4 = iVar16;
            }
            if (2 << ((byte)uVar15 & 0x1f) != iVar4 + 1) {
              __assert_fail("(1 << nRange) == Wln_ObjRange(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnWriteVer.c"
                            ,0x111,"void Wln_WriteVerInt(FILE *, Wln_Ntk_t *)");
            }
            pcVar18 = Wln_ObjName(p,iVar21);
            fprintf((FILE *)pFile,"%s ;\n",pcVar18);
            if ((long)(p->vRanges).nSize <= (long)uVar20) goto LAB_0038d44a;
            uVar3 = -uVar19;
            if (0 < (int)uVar19) {
              uVar3 = uVar19;
            }
            uVar15 = 0;
            while( true ) {
              iVar4 = (p->vRanges).pArray[uVar20];
              if (iVar4 < 0) goto LAB_0038d42b;
              pVVar1 = p->pRanges->vObjs;
              uVar19 = iVar4 * 4;
              if (pVVar1->nSize <= (int)uVar19) goto LAB_0038d42b;
              piVar12 = pVVar1->pArray;
              uVar17 = piVar12[uVar19] - piVar12[(ulong)uVar19 + 1];
              uVar19 = -uVar17;
              if (0 < (int)uVar17) {
                uVar19 = uVar17;
              }
              fwrite("         ",9,1,(FILE *)pFile);
              if (uVar19 < uVar15) break;
              fwrite("wire ",5,1,(FILE *)pFile);
              pcVar18 = Wln_ObjName(p,iVar21);
              fprintf((FILE *)pFile,"%s_",pcVar18);
              uVar19 = uVar3;
              do {
                fprintf((FILE *)pFile,"%d",(ulong)((uVar15 >> (uVar19 & 0x1f) & 1) != 0));
                bVar30 = uVar19 != 0;
                uVar19 = uVar19 - 1;
              } while (bVar30);
              fwrite(" = ",3,1,(FILE *)pFile);
              iVar4 = 0;
              do {
                uVar19 = uVar3 + iVar4;
                bVar30 = iVar4 == 0;
                iVar4 = iVar4 + -1;
                pcVar18 = " & ";
                if (bVar30) {
                  pcVar18 = "";
                }
                pcVar13 = "\r\n\t ";
                if ((uVar15 >> (uVar19 & 0x1f) & 1) == 0) {
                  pcVar13 = " & ~";
                }
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar6 = Wln_ObjName(p,paVar5->Array[0]);
                fprintf((FILE *)pFile,"%s%s%s[%d]",pcVar18,pcVar13 + 3,pcVar6,(ulong)uVar19);
              } while (uVar3 + iVar4 != -1);
              fwrite(" ;\n",3,1,(FILE *)pFile);
              uVar15 = uVar15 + 1;
              if ((long)(p->vRanges).nSize <= (long)uVar20) goto LAB_0038d44a;
            }
            pcVar18 = Wln_ObjName(p,iVar21);
            fprintf((FILE *)pFile,"assign %s = { ",pcVar18);
            if ((long)(p->vRanges).nSize <= (long)uVar20) goto LAB_0038d44a;
            iVar4 = (p->vRanges).pArray[uVar20];
            if (iVar4 < 0) goto LAB_0038d42b;
            pVVar1 = p->pRanges->vObjs;
            uVar15 = iVar4 * 4;
            if (pVVar1->nSize <= (int)uVar15) goto LAB_0038d42b;
            piVar12 = pVVar1->pArray;
            uVar19 = piVar12[uVar15] - piVar12[(ulong)uVar15 + 1];
            uVar15 = -uVar19;
            if (0 < (int)uVar19) {
              uVar15 = uVar19;
            }
            uVar19 = uVar15 + 1;
            do {
              if ((long)(p->vRanges).nSize <= (long)uVar20) goto LAB_0038d44a;
              iVar4 = (p->vRanges).pArray[uVar20];
              if (iVar4 < 0) goto LAB_0038d42b;
              pVVar1 = p->pRanges->vObjs;
              uVar17 = iVar4 * 4;
              if (pVVar1->nSize <= (int)uVar17) goto LAB_0038d42b;
              piVar12 = pVVar1->pArray;
              uVar22 = piVar12[uVar17] - piVar12[(ulong)uVar17 + 1];
              uVar17 = -uVar22;
              if (0 < (int)uVar22) {
                uVar17 = uVar22;
              }
              pcVar18 = "    \"%s\", ";
              if (uVar17 < uVar19) {
                pcVar18 = "T = %d\t\t";
              }
              pcVar13 = Wln_ObjName(p,iVar21);
              fprintf((FILE *)pFile,"%s%s_",pcVar18 + 8,pcVar13);
              uVar19 = uVar3;
              do {
                fprintf((FILE *)pFile,"%d",(ulong)((uVar15 >> (uVar19 & 0x1f) & 1) != 0));
                bVar30 = uVar19 != 0;
                uVar19 = uVar19 - 1;
              } while (bVar30);
              bVar30 = 0 < (int)uVar15;
              uVar19 = uVar15;
              uVar15 = uVar15 - 1;
            } while (bVar30);
            sVar23 = 5;
            pcVar18 = " } ;\n";
          }
          fwrite(pcVar18,sVar23,1,(FILE *)pFile);
        }
        goto LAB_0038c67e;
      }
      if (iVar4 < 0x61) {
        if (iVar4 == 0x4b) {
          pcVar18 = Wln_ObjName(p,iVar21);
          fprintf((FILE *)pFile,"%s ;           LUT",pcVar18);
          paVar5 = &p->vFanins[uVar20].field_2;
          if (2 < p->vFanins[uVar20].nSize) {
            paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
          }
          pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
          fprintf((FILE *)pFile," lut%d (%s, ",uVar20 & 0xffffffff,pcVar18);
          pWVar14 = p->vFanins;
          uVar24 = (ulong)(uint)pWVar14[uVar20].nSize;
          if (1 < pWVar14[uVar20].nSize) {
            lVar27 = 1;
            lVar29 = lVar25;
            do {
              if ((int)uVar24 < 3) {
                piVar12 = (int *)((long)&pWVar14->nCap + lVar29);
              }
              else {
                piVar12 = pWVar14[uVar20].field_2.pArray[0] + lVar27;
              }
              pcVar18 = Wln_ObjName(p,*piVar12);
              fprintf((FILE *)pFile,"%s, ",pcVar18);
              lVar27 = lVar27 + 1;
              pWVar14 = p->vFanins;
              uVar24 = (ulong)pWVar14[uVar20].nSize;
              lVar29 = lVar29 + 4;
            } while (lVar27 < (long)uVar24);
          }
        }
        else {
          if (iVar4 != 0x4d) goto LAB_0038c309;
          pcVar18 = Wln_ObjName(p,iVar21);
          paVar5 = &p->vFanins[uVar20].field_2;
          if (2 < p->vFanins[uVar20].nSize) {
            paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
          }
          fprintf((FILE *)pFile,"%s ;              table%d",pcVar18,(ulong)(uint)paVar5->Array[1]);
          paVar5 = &p->vFanins[uVar20].field_2;
          if (2 < p->vFanins[uVar20].nSize) {
            paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
          }
          pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
          fprintf((FILE *)pFile," s%d_Index(%s, ",uVar20 & 0xffffffff,pcVar18);
        }
        pcVar18 = Wln_ObjName(p,iVar21);
        pcVar13 = "%s)";
        goto LAB_0038bbd8;
      }
      if (iVar4 == 0x61) {
        pcVar18 = Wln_ObjName(p,iVar21);
        pcVar13 = Wln_ObjConstString(p,iVar21);
        fprintf((FILE *)pFile,"%-16s = %s",pcVar18,pcVar13);
        goto LAB_0038c4df;
      }
      if (iVar4 == 0x62) {
        pcVar18 = Wln_ObjName(p,iVar21);
        fprintf((FILE *)pFile,"%s ;\n",pcVar18);
        fwrite("         ",9,1,(FILE *)pFile);
        fwrite("assign ",7,1,(FILE *)pFile);
        pcVar18 = Wln_ObjName(p,iVar21);
        paVar5 = &p->vFanins[uVar20].field_2;
        if (2 < p->vFanins[uVar20].nSize) {
          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
        }
        pcVar13 = Wln_ObjName(p,paVar5->Array[0]);
        paVar5 = &p->vFanins[uVar20].field_2;
        if (2 < p->vFanins[uVar20].nSize) {
          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
        }
        pcVar6 = Wln_ObjName(p,paVar5[1].Array[0]);
        paVar5 = &p->vFanins[uVar20].field_2;
        if (2 < p->vFanins[uVar20].nSize) {
          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
        }
        pcVar7 = Wln_ObjName(p,*(int *)((long)paVar5 + 0xc));
        paVar5 = &p->vFanins[uVar20].field_2;
        if (2 < p->vFanins[uVar20].nSize) {
          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
        }
        pcVar8 = Wln_ObjName(p,paVar5->Array[1]);
        paVar5 = &p->vFanins[uVar20].field_2;
        if (2 < p->vFanins[uVar20].nSize) {
          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
        }
        pcVar9 = Wln_ObjName(p,paVar5[1].Array[0]);
        paVar5 = &p->vFanins[uVar20].field_2;
        if (2 < p->vFanins[uVar20].nSize) {
          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
        }
        pcVar10 = Wln_ObjName(p,*(int *)((long)paVar5 + 0xc));
        paVar5 = &p->vFanins[uVar20].field_2;
        if (2 < p->vFanins[uVar20].nSize) {
          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
        }
        pcVar11 = Wln_ObjName(p,paVar5->Array[1]);
        fprintf((FILE *)pFile,"%s = %s ? %s + %s + %s : %s - %s - %s ;\n",pcVar18,pcVar13,pcVar6,
                pcVar7,pcVar8,pcVar9,pcVar10,pcVar11);
        goto LAB_0038c67e;
      }
LAB_0038c309:
      iVar4 = Wln_ObjType(p,iVar21);
      if ((iVar4 == 0x50) || (iVar4 = Wln_ObjType(p,iVar21), iVar4 == 0x51)) {
        pcVar18 = Wln_ObjName(p,iVar21);
        fprintf((FILE *)pFile,"%s ;\n",pcVar18);
        fwrite("         ",9,1,(FILE *)pFile);
        iVar4 = Wln_ObjType(p,iVar21);
        pcVar18 = "ABC_WRITE";
        if (iVar4 == 0x50) {
          pcVar18 = "ABC_READ";
        }
        fprintf((FILE *)pFile,"%s (",pcVar18);
        pWVar14 = p->vFanins;
        uVar24 = (ulong)(uint)pWVar14[uVar20].nSize;
        if (0 < pWVar14[uVar20].nSize) {
          lVar27 = 0;
          lVar29 = lVar26;
          do {
            if ((int)uVar24 < 3) {
              piVar12 = (int *)((long)&pWVar14->nCap + lVar29);
            }
            else {
              piVar12 = pWVar14[uVar20].field_2.pArray[0] + lVar27;
            }
            if (*piVar12 != 0) {
              pcVar18 = "data";
              if (lVar27 == 1) {
                pcVar18 = "addr";
              }
              if (lVar27 == 0) {
                pcVar18 = "mem_in";
              }
              pcVar13 = Wln_ObjName(p,*piVar12);
              fprintf((FILE *)pFile," .%s(%s),",pcVar18,pcVar13);
              pWVar14 = p->vFanins;
            }
            lVar27 = lVar27 + 1;
            uVar24 = (ulong)pWVar14[uVar20].nSize;
            lVar29 = lVar29 + 4;
          } while (lVar27 < (long)uVar24);
        }
        iVar4 = Wln_ObjType(p,iVar21);
        pcVar18 = "mem_out";
        if (iVar4 == 0x50) {
          pcVar18 = "data";
        }
        pcVar13 = Wln_ObjName(p,iVar21);
        fprintf((FILE *)pFile," .%s(%s) ) ;\n",pcVar18,pcVar13);
      }
      else {
        iVar4 = Wln_ObjType(p,iVar21);
        pcVar18 = Wln_ObjName(p,iVar21);
        if (iVar4 == 0x59) {
          fprintf((FILE *)pFile,"%s ;\n",pcVar18);
        }
        else {
          fprintf((FILE *)pFile,"%-16s = ",pcVar18);
          iVar4 = Wln_ObjType(p,iVar21);
          if (iVar4 == 0xb) {
            paVar5 = &p->vFanins[uVar20].field_2;
            if (2 < p->vFanins[uVar20].nSize) {
              paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
            }
            iVar4 = paVar5->Array[0];
LAB_0038c7ce:
            pcVar18 = Wln_ObjName(p,iVar4);
            fputs(pcVar18,(FILE *)pFile);
          }
          else {
            iVar4 = Wln_ObjType(p,iVar21);
            if (iVar4 == 0x15) {
              paVar5 = &p->vFanins[uVar20].field_2;
              if (2 < p->vFanins[uVar20].nSize) {
                paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
              }
              pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
              fprintf((FILE *)pFile,"%s ? ",pcVar18);
              paVar5 = &p->vFanins[uVar20].field_2;
              if (2 < p->vFanins[uVar20].nSize) {
                paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
              }
              pcVar18 = Wln_ObjName(p,paVar5->Array[1]);
              fprintf((FILE *)pFile,"%s : ",pcVar18);
              paVar5 = &p->vFanins[uVar20].field_2;
              if (2 < p->vFanins[uVar20].nSize) {
                paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
              }
              iVar4 = paVar5[1].Array[0];
              goto LAB_0038c7ce;
            }
            iVar4 = Wln_ObjType(p,iVar21);
            if (iVar4 == 0x3a) {
              paVar5 = &p->vFanins[uVar20].field_2;
              if (2 < p->vFanins[uVar20].nSize) {
                paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
              }
              pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
              pcVar13 = "-%s";
LAB_0038bbd8:
              fprintf((FILE *)pFile,pcVar13,pcVar18);
            }
            else {
              iVar4 = Wln_ObjType(p,iVar21);
              if (iVar4 == 0xc) {
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                pcVar13 = "~%s";
                goto LAB_0038bbd8;
              }
              iVar4 = Wln_ObjType(p,iVar21);
              if (iVar4 == 0x24) {
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                pcVar13 = "!%s";
                goto LAB_0038bbd8;
              }
              iVar4 = Wln_ObjType(p,iVar21);
              if (iVar4 == 0x1e) {
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                pcVar13 = "&%s";
                goto LAB_0038bbd8;
              }
              iVar4 = Wln_ObjType(p,iVar21);
              if (iVar4 == 0x20) {
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                pcVar13 = "|%s";
                goto LAB_0038bbd8;
              }
              iVar4 = Wln_ObjType(p,iVar21);
              if (iVar4 == 0x22) {
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                pcVar13 = "^%s";
                goto LAB_0038bbd8;
              }
              iVar4 = Wln_ObjType(p,iVar21);
              if (iVar4 == 0x1f) {
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                pcVar13 = "~&%s";
                goto LAB_0038bbd8;
              }
              iVar4 = Wln_ObjType(p,iVar21);
              if (iVar4 == 0x21) {
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                fprintf((FILE *)pFile,"~|%s",pcVar18);
                goto LAB_0038c4df;
              }
              iVar4 = Wln_ObjType(p,iVar21);
              if (iVar4 == 0x23) {
                paVar5 = &p->vFanins[uVar20].field_2;
                if (2 < p->vFanins[uVar20].nSize) {
                  paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                }
                pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                pcVar13 = "~^%s";
LAB_0038ca6e:
                fprintf((FILE *)pFile,pcVar13,pcVar18);
              }
              else {
                iVar4 = Wln_ObjType(p,iVar21);
                if (iVar4 == 0x5b) {
                  paVar5 = &p->vFanins[uVar20].field_2;
                  if (2 < p->vFanins[uVar20].nSize) {
                    paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                  }
                  pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                  uVar3 = Wln_ObjRangeEnd(p,iVar21);
                  uVar15 = Wln_ObjRangeBeg(p,iVar21);
                  fprintf((FILE *)pFile,"%s [%d:%d]",pcVar18,(ulong)uVar3,(ulong)uVar15);
                }
                else {
                  iVar4 = Wln_ObjType(p,iVar21);
                  if (iVar4 == 0x5e) {
                    iVar4 = Wln_ObjRange(p,iVar21);
                    paVar5 = &p->vFanins[uVar20].field_2;
                    if (2 < p->vFanins[uVar20].nSize) {
                      paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                    }
                    iVar21 = Wln_ObjRange(p,paVar5->Array[0]);
                    paVar5 = &p->vFanins[uVar20].field_2;
                    if (2 < p->vFanins[uVar20].nSize) {
                      paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                    }
                    pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                    paVar5 = &p->vFanins[uVar20].field_2;
                    if (2 < p->vFanins[uVar20].nSize) {
                      paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                    }
                    iVar16 = Wln_ObjRange(p,paVar5->Array[0]);
                    paVar5 = &p->vFanins[uVar20].field_2;
                    if (2 < p->vFanins[uVar20].nSize) {
                      paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                    }
                    pcVar13 = Wln_ObjName(p,paVar5->Array[0]);
                    fprintf((FILE *)pFile,"{ {%d{%s[%d]}}, %s }",(ulong)(uint)(iVar4 - iVar21),
                            pcVar18,(ulong)(iVar16 - 1),pcVar13);
                  }
                  else {
                    iVar4 = Wln_ObjType(p,iVar21);
                    if (iVar4 == 0x5d) {
                      iVar4 = Wln_ObjRange(p,iVar21);
                      paVar5 = &p->vFanins[uVar20].field_2;
                      if (2 < p->vFanins[uVar20].nSize) {
                        paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                      }
                      iVar21 = Wln_ObjRange(p,paVar5->Array[0]);
                      paVar5 = &p->vFanins[uVar20].field_2;
                      if (2 < p->vFanins[uVar20].nSize) {
                        paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                      }
                      pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                      fprintf((FILE *)pFile,"{ {%d{1\'b0}}, %s }",(ulong)(uint)(iVar4 - iVar21),
                              pcVar18);
                    }
                    else {
                      iVar4 = Wln_ObjType(p,iVar21);
                      if (iVar4 == 0x5c) {
                        fputc(0x7b,(FILE *)pFile);
                        pWVar14 = p->vFanins;
                        uVar24 = (ulong)(uint)pWVar14[uVar20].nSize;
                        if (0 < pWVar14[uVar20].nSize) {
                          uVar28 = 0;
                          do {
                            if ((int)uVar24 < 3) {
                              piVar12 = (int *)((long)&pWVar14->nCap + lVar26);
                            }
                            else {
                              piVar12 = pWVar14[uVar20].field_2.pArray[0];
                            }
                            if (piVar12[uVar28] != 0) {
                              pcVar18 = Wln_ObjName(p,piVar12[uVar28]);
                              pcVar13 = ",";
                              if (uVar28 == p->vFanins[uVar20].nSize - 1) {
                                pcVar13 = "";
                              }
                              fprintf((FILE *)pFile," %s%s",pcVar18,pcVar13);
                              pWVar14 = p->vFanins;
                            }
                            uVar28 = uVar28 + 1;
                            uVar24 = (ulong)pWVar14[uVar20].nSize;
                          } while ((long)uVar28 < (long)uVar24);
                        }
                        fwrite(" }",2,1,(FILE *)pFile);
                      }
                      else {
                        paVar5 = &p->vFanins[uVar20].field_2;
                        if (2 < p->vFanins[uVar20].nSize) {
                          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                        }
                        pcVar18 = Wln_ObjName(p,paVar5->Array[0]);
                        fprintf((FILE *)pFile,"%s ",pcVar18);
                        iVar4 = Wln_ObjType(p,iVar21);
                        if (iVar4 == 0x45) {
                          sVar23 = 2;
                          pcVar18 = ">>";
LAB_0038ce51:
                          fwrite(pcVar18,sVar23,1,(FILE *)pFile);
                        }
                        else {
                          iVar4 = Wln_ObjType(p,iVar21);
                          if (iVar4 == 0x47) {
                            sVar23 = 3;
                            pcVar18 = ">>>";
                            goto LAB_0038ce51;
                          }
                          iVar4 = Wln_ObjType(p,iVar21);
                          if (iVar4 == 0x44) {
                            sVar23 = 2;
                            pcVar18 = "<<";
                            goto LAB_0038ce51;
                          }
                          iVar4 = Wln_ObjType(p,iVar21);
                          if (iVar4 == 0x46) {
                            sVar23 = 3;
                            pcVar18 = "<<<";
                            goto LAB_0038ce51;
                          }
                          iVar4 = Wln_ObjType(p,iVar21);
                          if (iVar4 == 0xd) {
                            iVar4 = 0x26;
LAB_0038cf4b:
                            fputc(iVar4,(FILE *)pFile);
                          }
                          else {
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0xf) {
                              iVar4 = 0x7c;
                              goto LAB_0038cf4b;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x11) {
                              iVar4 = 0x5e;
                              goto LAB_0038cf4b;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0xe) {
                              sVar23 = 2;
                              pcVar18 = "~&";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x10) {
                              sVar23 = 2;
                              pcVar18 = "~|";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x12) {
                              sVar23 = 2;
                              pcVar18 = "~^";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x5f) {
                              sVar23 = 2;
                              pcVar18 = "=>";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x25) {
                              sVar23 = 2;
                              pcVar18 = "&&";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x27) {
                              sVar23 = 2;
                              pcVar18 = "||";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x29) {
                              sVar23 = 2;
                              pcVar18 = "^^";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x42) {
                              sVar23 = 2;
                              pcVar18 = "==";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x43) {
                              sVar23 = 2;
                              pcVar18 = "!=";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x3e) {
                              iVar4 = 0x3c;
                              goto LAB_0038cf4b;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x41) {
                              iVar4 = 0x3e;
                              goto LAB_0038cf4b;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x3f) {
                              sVar23 = 2;
                              pcVar18 = "<=";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x40) {
                              sVar23 = 2;
                              pcVar18 = ">=";
                              goto LAB_0038ce51;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x32) {
                              iVar4 = 0x2b;
                              goto LAB_0038cf4b;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x33) {
                              iVar4 = 0x2d;
                              goto LAB_0038cf4b;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x34) {
                              iVar4 = 0x2a;
                              goto LAB_0038cf4b;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if (iVar4 == 0x36) {
                              iVar4 = 0x2f;
                              goto LAB_0038cf4b;
                            }
                            iVar4 = Wln_ObjType(p,iVar21);
                            if ((iVar4 != 0x38) && (iVar4 = Wln_ObjType(p,iVar21), iVar4 != 0x37)) {
                              iVar4 = Wln_ObjType(p,iVar21);
                              if (iVar4 == 0x39) {
                                sVar23 = 2;
                                pcVar18 = "**";
                                goto LAB_0038ce51;
                              }
                              iVar4 = Wln_ObjType(p,iVar21);
                              if (iVar4 == 0x3b) {
                                iVar4 = 0x40;
                              }
                              else {
                                iVar4 = Wln_ObjType(p,iVar21);
                                if (iVar4 != 0x60) {
                                  pcVar18 = Wln_ObjName(p,iVar21);
                                  uVar3 = Wln_ObjType(p,iVar21);
                                  printf("Failed to write node \"%s\" with unknown operator type (%d).\n"
                                         ,pcVar18,(ulong)uVar3);
                                  fwrite("???\n",4,1,(FILE *)pFile);
                                  goto LAB_0038c67e;
                                }
                                iVar4 = 0x23;
                              }
                              goto LAB_0038cf4b;
                            }
                            fprintf((FILE *)pFile,"%%");
                          }
                        }
                        paVar5 = &p->vFanins[uVar20].field_2;
                        if (2 < p->vFanins[uVar20].nSize) {
                          paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                        }
                        pcVar18 = Wln_ObjName(p,paVar5->Array[1]);
                        fprintf((FILE *)pFile," %s",pcVar18);
                        if ((p->vFanins[uVar20].nSize == 3) &&
                           (iVar4 = Wln_ObjType(p,iVar21), iVar4 == 0x32)) {
                          paVar5 = &p->vFanins[uVar20].field_2;
                          if (2 < p->vFanins[uVar20].nSize) {
                            paVar5 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar5->pArray[0];
                          }
                          pcVar18 = Wln_ObjName(p,paVar5[1].Array[0]);
                          pcVar13 = " + %s";
                          goto LAB_0038ca6e;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0038c4df:
          pcVar18 = "";
          if (p->fSmtLib != 0) {
            if ((long)(p->vSigns).nSize <= (long)uVar20) {
LAB_0038d469:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            pcVar18 = " // signed SMT-LIB operator";
            if ((p->vSigns).pArray[uVar20] == '\0') {
              pcVar18 = "";
            }
          }
          fprintf((FILE *)pFile," ;%s\n",pcVar18);
        }
      }
LAB_0038c67e:
      uVar20 = uVar20 + 1;
      lVar26 = lVar26 + 0x10;
      lVar25 = lVar25 + 0x10;
    } while ((long)uVar20 < (long)(p->vTypes).nSize);
  }
  fputc(10,(FILE *)pFile);
  if (0 < (p->vFfs).nSize) {
    lVar25 = 0;
    do {
      iVar4 = (p->vFfs).pArray[lVar25];
      fwrite("         ",9,1,(FILE *)pFile);
      fprintf((FILE *)pFile,"%s (","ABC_DFFRSE");
      pWVar14 = p->vFanins;
      uVar20 = (ulong)(uint)pWVar14[iVar4].nSize;
      if (0 < pWVar14[iVar4].nSize) {
        lVar26 = 0;
        lVar29 = 0;
        do {
          if ((int)uVar20 < 3) {
            piVar12 = (int *)((long)&pWVar14[iVar4].field_2 + lVar26);
          }
          else {
            piVar12 = pWVar14[iVar4].field_2.pArray[0] + lVar29;
          }
          if (*piVar12 != 0) {
            iVar21 = *(int *)((long)&DAT_009a8388 + lVar26);
            pcVar18 = Wln_ObjName(p,*piVar12);
            fprintf((FILE *)pFile," .%s(%s),",(long)&DAT_009a8388 + (long)iVar21,pcVar18);
            pWVar14 = p->vFanins;
          }
          lVar29 = lVar29 + 1;
          uVar20 = (ulong)pWVar14[iVar4].nSize;
          lVar26 = lVar26 + 4;
        } while (lVar29 < (long)uVar20);
      }
      pcVar18 = Wln_ObjName(p,iVar4);
      fprintf((FILE *)pFile," .%s(%s) ) ;\n","q",pcVar18);
      lVar25 = lVar25 + 1;
    } while (lVar25 < (p->vFfs).nSize);
  }
  fputc(10,(FILE *)pFile);
  fwrite("endmodule\n\n",0xb,1,(FILE *)pFile);
  return;
}

Assistant:

void Wln_WriteVerInt( FILE * pFile, Wln_Ntk_t * p )
{
    int k, j, iObj, iFanin;
    char Range[100];
    fprintf( pFile, "module %s ( ", p->pName );
    fprintf( pFile, "\n   " );
    if ( Wln_NtkCiNum(p) > 0 )
    {
        Wln_WriteVerIntVec( pFile, p, &p->vCis, 3 );
        fprintf( pFile, ",\n   " );
    }
    if ( Wln_NtkCoNum(p) > 0 )
        Wln_WriteVerIntVec( pFile, p, &p->vCos, 3 );
    fprintf( pFile, "  );\n" );
    Wln_NtkForEachObj( p, iObj )
    {
        int End = Wln_ObjRangeEnd(p, iObj);
        int Beg = Wln_ObjRangeBeg(p, iObj);
        int nDigits = Abc_Base10Log(Abc_AbsInt(End)+1) + Abc_Base10Log(Abc_AbsInt(Beg)+1) + (int)(End < 0) + (int)(Beg < 0);
        sprintf( Range, "%s[%d:%d]%*s", (!p->fSmtLib && Wln_ObjIsSigned(p, iObj)) ? "signed ":"       ", End, Beg, 8-nDigits, "" );
        fprintf( pFile, "  " );
        if ( Wln_ObjIsCi(p, iObj) )
            fprintf( pFile, "input  " );
        else if ( Wln_ObjIsCo(p, iObj) )
            fprintf( pFile, "output " );
        else
            fprintf( pFile, "       " );
        if ( Wln_ObjIsCio(p, iObj) )
        {
            fprintf( pFile, "wire %s %s ;\n", Range, Wln_ObjName(p, iObj) );
            if ( Wln_ObjIsCi(p, iObj) )
                continue;
            fprintf( pFile, "  assign                         " );
            fprintf( pFile, "%-16s = %s ;\n", Wln_ObjName(p, iObj), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            continue;
        }
        if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_NMUX || Wln_ObjType(p, iObj) == ABC_OPER_SEL_SEL )
            fprintf( pFile, "reg  %s ", Range );
        else
            fprintf( pFile, "wire %s ", Range );
        if ( Wln_ObjType(p, iObj) == ABC_OPER_TABLE )
        {
            // wire [3:0] s4972; table0 s4972_Index(s4971, s4972);
            fprintf( pFile, "%s ;              table%d", Wln_ObjName(p, iObj), Wln_ObjFanin1(p, iObj) );
            fprintf( pFile, " s%d_Index(%s, ", iObj, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            fprintf( pFile, "%s)",             Wln_ObjName(p, iObj) );
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_LUT )
        {
            // wire [3:0] s4972; LUT lut4972_Index(s4971, s4972);
            fprintf( pFile, "%s ;           LUT", Wln_ObjName(p, iObj) );
            fprintf( pFile, " lut%d (%s, ", iObj, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            for ( k = 1; k < Wln_ObjFaninNum(p, iObj); k++ )
                fprintf( pFile, "%s, ", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, "%s)",             Wln_ObjName(p, iObj) );
        }
        else if ( Wln_ObjIsConst(p, iObj) )
            fprintf( pFile, "%-16s = %s", Wln_ObjName(p, iObj), Wln_ObjConstString(p, iObj) );
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTR || Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTL )
        {
            //  wire [27:0] s4960 = (s57 >> 17) | (s57 << 11);
            int Num0 = Wln_ObjFanin1(p, iObj);
            int Num1 = Wln_ObjRange(p, iObj) - Num0;
            assert( Num0 > 0 && Num0 < Wln_ObjRange(p, iObj) );
            fprintf( pFile, "%-16s = ", Wln_ObjName(p, iObj) );
            if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_ROTR )
                fprintf( pFile, "(%s >> %d) | (%s << %d)", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num0, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num1 );
            else
                fprintf( pFile, "(%s << %d) | (%s >> %d)", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num0, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Num1 );
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_NMUX )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "always @( " );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
                fprintf( pFile, "%s%s", k ? " or ":"", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, " )\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "begin\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "case ( %s )\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
            {
                if ( !k ) continue;
                fprintf( pFile, "               " );
                fprintf( pFile, "%d : %s = ", k-1, Wln_ObjName(p, iObj) );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            }
            fprintf( pFile, "             " );
            fprintf( pFile, "endcase\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "end\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_SEL )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "always @( " );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
                fprintf( pFile, "%s%s", k ? " or ":"", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            fprintf( pFile, " )\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "begin\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "case ( %s )\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
            Wln_ObjForEachFanin( p, iObj, iFanin, k )
            {
                if ( !k ) continue;
                fprintf( pFile, "               " );
                fprintf( pFile, "%d\'b", Wln_ObjFaninNum(p, iObj)-1 );
                for ( j = Wln_ObjFaninNum(p, iObj)-1; j > 0; j-- )
                    fprintf( pFile, "%d", (int)(j==k) );
                fprintf( pFile, " : %s = ", Wln_ObjName(p, iObj) );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)) );
            }
            fprintf( pFile, "               " );
            fprintf( pFile, "default" );
            fprintf( pFile, " : %s = ", Wln_ObjName(p, iObj) );
            fprintf( pFile, "%d\'b", Wln_ObjRange(p, iObj) );
            for ( j = Wln_ObjRange(p, iObj)-1; j >= 0; j-- )
                fprintf( pFile, "%d", 0 );
            fprintf( pFile, " ;\n" );
            fprintf( pFile, "             " );
            fprintf( pFile, "endcase\n" );
            fprintf( pFile, "           " );
            fprintf( pFile, "end\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_SEL_DEC )
        {
            int nRange = Wln_ObjRange(p, Wln_ObjFanin0(p, iObj));
            assert( (1 << nRange) == Wln_ObjRange(p, iObj) );
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            for ( k = 0; k < Wln_ObjRange(p, iObj); k++ )
            {
                fprintf( pFile, "         " );
                fprintf( pFile, "wire " );
                fprintf( pFile, "%s_", Wln_ObjName(p, iObj) );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%d", (k >> (nRange-1-j)) & 1 );
                fprintf( pFile, " = " );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%s%s%s[%d]", 
                        j ? " & ":"", ((k >> (nRange-1-j)) & 1) ? " ":"~", 
                        Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)), nRange-1-j );
                fprintf( pFile, " ;\n" );
            }
            fprintf( pFile, "         " );
            fprintf( pFile, "assign %s = { ", Wln_ObjName(p, iObj) );
            for ( k = Wln_ObjRange(p, iObj)-1; k >= 0; k-- )
            {
                fprintf( pFile, "%s%s_", k < Wln_ObjRange(p, iObj)-1 ? ", ":"", Wln_ObjName(p, iObj) );
                for ( j = 0; j < nRange; j++ )
                    fprintf( pFile, "%d", (k >> (nRange-1-j)) & 1 );
            }
            fprintf( pFile, " } ;\n" );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADDSUB )
        {
            // out = mode ? a+b+cin : a-b-cin
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            fprintf( pFile, "         " );
            fprintf( pFile, "assign " );
            fprintf( pFile, "%s = %s ? %s + %s + %s : %s - %s - %s ;\n", 
                        Wln_ObjName(p, iObj), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)),
                        Wln_ObjName(p, Wln_ObjFanin2(p, iObj)), Wln_ObjName(p, Wln_ObjFanin(p, iObj,3)), Wln_ObjName(p, Wln_ObjFanin1(p, iObj)),
                        Wln_ObjName(p, Wln_ObjFanin2(p, iObj)), Wln_ObjName(p, Wln_ObjFanin(p, iObj,3)), Wln_ObjName(p, Wln_ObjFanin1(p, iObj)) 
                   );
            continue;
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_RAMR || Wln_ObjType(p, iObj) == ABC_OPER_RAMW )
        {
            if ( 1 )
            {
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
                fprintf( pFile, "         " );
                fprintf( pFile, "%s (", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "ABC_READ" : "ABC_WRITE" );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " .%s(%s),", k==0 ? "mem_in" : (k==1 ? "addr": "data"), Wln_ObjName(p, iFanin) );
                fprintf( pFile, " .%s(%s) ) ;\n", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "data" : "mem_out", Wln_ObjName(p, iObj) );
                continue;
            }
            else
            {
                int nBitsMem  = Wln_ObjRange(p,  Wln_ObjFanin(p, iObj, 0) );
                //int nBitsAddr = Wln_ObjRange(p,  Wln_ObjFanin(p, iObj, 1) );
                int nBitsDat  = Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? Wln_ObjRange(p, iObj) : Wln_ObjRange(p, Wln_ObjFanin(p, iObj, 2));
                int Depth     = nBitsMem / nBitsDat;
                assert( nBitsMem % nBitsDat == 0 );
                fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
                fprintf( pFile, "         " );
                fprintf( pFile, "%s_%d (", Wln_ObjType(p, iObj) == ABC_OPER_RAMR ? "CPL_MEM_READ" : "CPL_MEM_WRITE", Depth );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " .%s(%s),", k==0 ? "mem_data_in" : (k==1 ? "addr_in": "data_in"), Wln_ObjName(p, iFanin) );
                fprintf( pFile, " .%s(%s) ) ;\n", "data_out", Wln_ObjName(p, iObj) );
                continue;
            }
        }
        else if ( Wln_ObjType(p, iObj) == ABC_OPER_DFFRSE )
        {
            fprintf( pFile, "%s ;\n", Wln_ObjName(p, iObj) );
            continue;
        }
        else 
        {
            fprintf( pFile, "%-16s = ", Wln_ObjName(p, iObj) );
            if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_BUF )
                fprintf( pFile, "%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_MUX )
            {
                fprintf( pFile, "%s ? ", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
                fprintf( pFile, "%s : ", Wln_ObjName(p, Wln_ObjFanin1(p, iObj)) );
                fprintf( pFile, "%s",    Wln_ObjName(p, Wln_ObjFanin2(p, iObj)) );
            }
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MIN )
                fprintf( pFile, "-%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_INV )
                fprintf( pFile, "~%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_NOT )
                fprintf( pFile, "!%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_AND )
                fprintf( pFile, "&%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_OR )
                fprintf( pFile, "|%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_XOR )
                fprintf( pFile, "^%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NAND )
                fprintf( pFile, "~&%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NOR )
                fprintf( pFile, "~|%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_RED_NXOR )
                fprintf( pFile, "~^%s", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_SLICE )
                fprintf( pFile, "%s [%d:%d]", Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Wln_ObjRangeEnd(p, iObj), Wln_ObjRangeBeg(p, iObj) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_SIGNEXT )
                fprintf( pFile, "{ {%d{%s[%d]}}, %s }", Wln_ObjRange(p, iObj) - Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)), Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)) - 1, Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_ZEROPAD )
                fprintf( pFile, "{ {%d{1\'b0}}, %s }", Wln_ObjRange(p, iObj) - Wln_ObjRange(p, Wln_ObjFanin0(p, iObj)), Wln_ObjName(p, Wln_ObjFanin0(p, iObj)) );
            else if ( Wln_ObjType(p, iObj) == ABC_OPER_CONCAT )
            {
                fprintf( pFile, "{" );
                Wln_ObjForEachFanin( p, iObj, iFanin, k )
                    fprintf( pFile, " %s%s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, k)), k == Wln_ObjFaninNum(p, iObj)-1 ? "":"," );
                fprintf( pFile, " }" );
            }
            else
            {
                fprintf( pFile, "%s ", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 0)) );
                if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_R )
                    fprintf( pFile, ">>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_RA )
                    fprintf( pFile, ">>>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_L )
                    fprintf( pFile, "<<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_SHIFT_LA )
                    fprintf( pFile, "<<<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_AND )
                    fprintf( pFile, "&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_OR )
                    fprintf( pFile, "|" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_XOR )
                    fprintf( pFile, "^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NAND )
                    fprintf( pFile, "~&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NOR )
                    fprintf( pFile, "~|" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_BIT_NXOR )
                    fprintf( pFile, "~^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_IMPL )
                    fprintf( pFile, "=>" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_AND )
                    fprintf( pFile, "&&" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_OR )
                    fprintf( pFile, "||" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_LOGIC_XOR )
                    fprintf( pFile, "^^" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_EQU )
                    fprintf( pFile, "==" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_NOTEQU )
                    fprintf( pFile, "!=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_LESS )
                    fprintf( pFile, "<" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_MORE )
                    fprintf( pFile, ">" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_LESSEQU )
                    fprintf( pFile, "<=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_COMP_MOREEQU )
                    fprintf( pFile, ">=" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADD )
                    fprintf( pFile, "+" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SUB )
                    fprintf( pFile, "-" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MUL )
                    fprintf( pFile, "*" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_DIV )
                    fprintf( pFile, "/" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_REM )
                    fprintf( pFile, "%%" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_MOD )
                    fprintf( pFile, "%%" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_POW )
                    fprintf( pFile, "**" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SQRT )
                    fprintf( pFile, "@" );
                else if ( Wln_ObjType(p, iObj) == ABC_OPER_ARI_SQUARE )
                    fprintf( pFile, "#" );
                else 
                {
                    //assert( 0 );
                    printf( "Failed to write node \"%s\" with unknown operator type (%d).\n", Wln_ObjName(p, iObj), Wln_ObjType(p, iObj) );
                    fprintf( pFile, "???\n" );
                    continue;
                }
                fprintf( pFile, " %s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 1)) );
                if ( Wln_ObjFaninNum(p, iObj) == 3 && Wln_ObjType(p, iObj) == ABC_OPER_ARI_ADD ) 
                    fprintf( pFile, " + %s", Wln_ObjName(p, Wln_ObjFanin(p, iObj, 2)) );
            }
        }
        fprintf( pFile, " ;%s\n", (p->fSmtLib && Wln_ObjIsSigned(p, iObj)) ? " // signed SMT-LIB operator" : "" );
    }
    iFanin = 0;
    // write DFFs in the end
    fprintf( pFile, "\n" );
    Wln_NtkForEachFf( p, iObj, j )
    {
        char * pInNames[8] = {"d", "clk", "reset", "set", "enable", "async", "sre", "init"};
        fprintf( pFile, "         " );
        fprintf( pFile, "%s (", "ABC_DFFRSE" );
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            if ( iFanin ) fprintf( pFile, " .%s(%s),", pInNames[k], Wln_ObjName(p, iFanin) );
        fprintf( pFile, " .%s(%s) ) ;\n", "q", Wln_ObjName(p, iObj) );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "endmodule\n\n" );
}